

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::convertSwizzle
          (TGlslangToSpvTraverser *this,TIntermAggregate *node,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *swizzle)

{
  int iVar1;
  undefined8 in_RAX;
  undefined4 extraout_var;
  long lVar2;
  int i;
  long lVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  iVar1 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0x33])();
  lVar3 = 0;
  while( true ) {
    lVar2 = *(long *)(CONCAT44(extraout_var,iVar1) + 8);
    if ((int)((ulong)(*(long *)(CONCAT44(extraout_var,iVar1) + 0x10) - lVar2) >> 3) <= lVar3) break;
    lVar2 = (**(code **)(**(long **)(lVar2 + lVar3 * 8) + 0x28))();
    uStack_28 = CONCAT44(**(undefined4 **)(*(long *)(lVar2 + 0xc0) + 8),(undefined4)uStack_28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)node,
               (uint *)((long)&uStack_28 + 4));
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::convertSwizzle(const glslang::TIntermAggregate& node, std::vector<unsigned>& swizzle)
{
    const glslang::TIntermSequence& swizzleSequence = node.getSequence();
    for (int i = 0; i < (int)swizzleSequence.size(); ++i)
        swizzle.push_back(swizzleSequence[i]->getAsConstantUnion()->getConstArray()[0].getIConst());
}